

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiekeypath.cpp
# Opt level: O2

bool __thiscall LOTKeyPath::matches(LOTKeyPath *this,string *key,uint32_t depth)

{
  pointer pbVar1;
  bool bVar2;
  __type _Var3;
  bool bVar4;
  ulong uVar5;
  
  bVar2 = std::operator==(key,"__");
  bVar4 = true;
  if (!bVar2) {
    uVar5 = (ulong)depth;
    pbVar1 = (this->mKeys).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(this->mKeys).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U < uVar5) {
      bVar4 = false;
    }
    else {
      _Var3 = std::operator==(pbVar1 + uVar5,key);
      if (!_Var3) {
        bVar2 = std::operator==((this->mKeys).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar5,"*");
        if (!bVar2) {
          bVar2 = std::operator==((this->mKeys).
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar5,"**");
          return bVar2;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool LOTKeyPath::matches(const std::string &key, uint32_t depth)
{
    if (skip(key)) {
        // This is an object we programatically create.
        return true;
    }
    if (depth > size()) {
        return false;
    }
    if ((mKeys[depth] == key) || (mKeys[depth] == "*") ||
        (mKeys[depth] == "**")) {
        return true;
    }
    return false;
}